

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::Message::Message(Message *this,Message *param_1)

{
  field<discordpp::Snowflake>::field(&this->id,&param_1->id);
  field<discordpp::Snowflake>::field(&this->channel_id,&param_1->channel_id);
  field<discordpp::User>::field(&this->author,&param_1->author);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->content,&param_1->content);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->timestamp,&param_1->timestamp);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  nullable_field(&this->edited_timestamp,&param_1->edited_timestamp);
  field<bool>::field(&this->tts,&param_1->tts);
  field<bool>::field(&this->mention_everyone,&param_1->mention_everyone);
  field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>::field
            (&this->mentions,&param_1->mentions);
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::field
            (&this->mention_roles,&param_1->mention_roles);
  omittable_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
  ::omittable_field(&this->mention_channels,&param_1->mention_channels);
  field<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>::field
            (&this->attachments,&param_1->attachments);
  field<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>::field
            (&this->embeds,&param_1->embeds);
  omittable_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>::
  omittable_field(&this->reactions,&param_1->reactions);
  omittable_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::omittable_field(&this->nonce,&param_1->nonce);
  field<bool>::field(&this->pinned,&param_1->pinned);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->webhook_id,&param_1->webhook_id);
  field<int>::field(&this->type,&param_1->type);
  omittable_field<discordpp::MessageActivity>::omittable_field(&this->activity,&param_1->activity);
  omittable_field<discordpp::Application>::omittable_field(&this->application,&param_1->application)
  ;
  omittable_field<discordpp::Snowflake>::omittable_field
            (&this->application_id,&param_1->application_id);
  omittable_field<discordpp::MessageReference>::omittable_field
            (&this->message_reference,&param_1->message_reference);
  omittable_field<int>::omittable_field(&this->flags,&param_1->flags);
  nullable_omittable_field<discordpp::Message>::nullable_omittable_field
            (&this->referenced_message,&param_1->referenced_message);
  omittable_field<discordpp::MessageInteraction>::omittable_field
            (&this->interaction,&param_1->interaction);
  omittable_field<discordpp::Channel>::omittable_field(&this->thread,&param_1->thread);
  omittable_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>::
  omittable_field(&this->components,&param_1->components);
  omittable_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>::
  omittable_field(&this->sticker_items,&param_1->sticker_items);
  omittable_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>::
  omittable_field(&this->stickers,&param_1->stickers);
  omittable_field<int>::omittable_field(&this->position,&param_1->position);
  omittable_field<discordpp::RoleSubscriptionData>::omittable_field
            (&this->role_subscription_data,&param_1->role_subscription_data);
  return;
}

Assistant:

Message(
        field<Snowflake> id = uninitialized,
        field<Snowflake> channel_id = uninitialized,
        field<User> author = uninitialized,
        field<std::string> content = uninitialized,
        field<Timestamp> timestamp = uninitialized,
        nullable_field<Timestamp> edited_timestamp = uninitialized,
        field<bool> tts = uninitialized,
        field<bool> mention_everyone = uninitialized,
        field<std::vector<User> > mentions = uninitialized,
        field<std::vector<Snowflake> > mention_roles = uninitialized,
        omittable_field<std::vector<ChannelMention> > mention_channels = omitted,
        field<std::vector<Attachment> > attachments = uninitialized,
        field<std::vector<Embed> > embeds = uninitialized,
        omittable_field<std::vector<Reaction> > reactions = omitted,
        omittable_field<std::variant<int, std::string> > nonce = omitted,
        field<bool> pinned = uninitialized,
        omittable_field<Snowflake> webhook_id = omitted,
        field<int> type = uninitialized,
        omittable_field<MessageActivity> activity = omitted,
        omittable_field<Application> application = omitted,
        omittable_field<Snowflake> application_id = omitted,
        omittable_field<MessageReference> message_reference = omitted,
        omittable_field<int> flags = omitted,
        nullable_omittable_field<Message> referenced_message = omitted,
        omittable_field<MessageInteraction> interaction = omitted,
        omittable_field<Channel> thread = omitted,
        omittable_field<std::vector<Component> > components = omitted,
        omittable_field<std::vector<StickerItem> > sticker_items = omitted,
        omittable_field<std::vector<Sticker> > stickers = omitted,
        omittable_field<int> position = omitted,
        omittable_field<RoleSubscriptionData> role_subscription_data = omitted
    ):
        id(id),
        channel_id(channel_id),
        author(author),
        content(content),
        timestamp(timestamp),
        edited_timestamp(edited_timestamp),
        tts(tts),
        mention_everyone(mention_everyone),
        mentions(mentions),
        mention_roles(mention_roles),
        mention_channels(mention_channels),
        attachments(attachments),
        embeds(embeds),
        reactions(reactions),
        nonce(nonce),
        pinned(pinned),
        webhook_id(webhook_id),
        type(type),
        activity(activity),
        application(application),
        application_id(application_id),
        message_reference(message_reference),
        flags(flags),
        referenced_message(referenced_message),
        interaction(interaction),
        thread(thread),
        components(components),
        sticker_items(sticker_items),
        stickers(stickers),
        position(position),
        role_subscription_data(role_subscription_data)
    {}